

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intgemm.cc
# Opt level: O0

void intgemm::UnsupportedCPUError(void)

{
  undefined8 uVar1;
  UnsupportedCPU *in_stack_fffffffffffffff0;
  
  uVar1 = __cxa_allocate_exception(8);
  UnsupportedCPU::UnsupportedCPU(in_stack_fffffffffffffff0);
  __cxa_throw(uVar1,&UnsupportedCPU::typeinfo,UnsupportedCPU::~UnsupportedCPU);
}

Assistant:

void UnsupportedCPUError() {
#if (defined(_MSC_VER) && !defined(__clang__)) ? (_HAS_EXCEPTIONS) : (__EXCEPTIONS)
  throw UnsupportedCPU();
#else
  fprintf(stderr, "intgemm does not support this CPU.\n");
  abort();
#endif
}